

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O2

uint Nm_HashString(char *pName,int TableSize)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  while( true ) {
    cVar1 = pName[uVar2];
    if (cVar1 == '\0') break;
    uVar3 = uVar3 ^ (int)cVar1 * (int)cVar1 * Nm_HashString::s_Primes[(ulong)uVar2 % 10];
    uVar2 = uVar2 + 1;
  }
  return uVar3 % (uint)TableSize;
}

Assistant:

static unsigned Nm_HashString( char * pName, int TableSize ) 
{
    static int s_Primes[10] = { 
        1291, 1699, 2357, 4177, 5147, 
        5647, 6343, 7103, 7873, 8147
    };
    unsigned i, Key = 0;
    for ( i = 0; pName[i] != '\0'; i++ )
        Key ^= s_Primes[i%10]*pName[i]*pName[i];
    return Key % TableSize;
}